

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

RandomNormalStaticLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::RandomNormalStaticLayerParams>
          (Arena *arena)

{
  RandomNormalStaticLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (RandomNormalStaticLayerParams *)operator_new(0x40);
    CoreML::Specification::RandomNormalStaticLayerParams::RandomNormalStaticLayerParams
              (this,(Arena *)0x0,false);
  }
  else {
    this = (RandomNormalStaticLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x40,
                      (type_info *)&CoreML::Specification::RandomNormalStaticLayerParams::typeinfo);
    CoreML::Specification::RandomNormalStaticLayerParams::RandomNormalStaticLayerParams
              (this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }